

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O3

bool_t wwIsRepW_fast(word *a,size_t n,word w)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  
  if (n == 0) {
    bVar3 = w == 0;
  }
  else {
    lVar1 = n - 1;
    do {
      bVar2 = lVar1 != 0;
      bVar3 = a[lVar1] == w;
      if (!bVar3) break;
      lVar1 = lVar1 + -1;
    } while (bVar2);
  }
  return (bool_t)bVar3;
}

Assistant:

bool_t FAST(wwIsRepW)(const word a[], size_t n, register word w)
{
	register bool_t ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = (w == 0);
	else
	{
		do
			ret = (a[--n] == w);
		while (ret && n);
	}
	w = 0;
	return ret;
}